

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseRanges(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  HMpsFF *pHVar1;
  bool bVar2;
  undefined8 uVar3;
  HMpsFF *in_RSI;
  long in_RDI;
  reference rVar4;
  reference rVar5;
  double value_1;
  bool is_nan_1;
  iterator mit_1;
  size_t end_marker_1;
  string marker_1;
  double value;
  bool is_nan;
  iterator mit;
  size_t end_marker;
  string marker;
  HighsInt rowidx;
  Parsekey key;
  string word_1;
  size_t end;
  size_t begin;
  size_t report_ignored_duplicate_range_frequency;
  size_t num_ignored_duplicate_range;
  size_t report_ignored_row_name_frequency;
  size_t num_ignored_row_name;
  bool skip;
  anon_class_8_1_8991fb9c addRhs;
  anon_class_8_1_8991fb9c parseName;
  string word;
  string strline;
  string *in_stack_fffffffffffffd18;
  HMpsFF *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  HMpsFF *in_stack_fffffffffffffd30;
  HMpsFF *in_stack_fffffffffffffd38;
  _Bit_type in_stack_fffffffffffffd40;
  vector<bool,_std::allocator<bool>_> *this_00;
  _Bit_type *in_stack_fffffffffffffd48;
  HighsLogOptions *in_stack_fffffffffffffd50;
  HMpsFF *in_stack_fffffffffffffd58;
  HMpsFF *in_stack_fffffffffffffd60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffd68;
  HMpsFF *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  size_t in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  bool local_1f1;
  _Bit_type *in_stack_fffffffffffffe28;
  _Bit_type in_stack_fffffffffffffe30;
  reference rVar6;
  HighsLogOptions *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  byte in_stack_fffffffffffffe47;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffe48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_1b0;
  string local_1a8 [32];
  size_t local_188;
  string local_180 [32];
  reference local_160;
  HighsLogOptions *local_150;
  byte local_141;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_140;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_138;
  string local_130 [32];
  size_t local_110;
  string local_108 [32];
  int local_e8;
  Parsekey local_e4;
  string local_e0 [32];
  size_t local_c0;
  int local_ac;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  byte local_85;
  undefined1 local_71;
  string local_60 [32];
  string local_40 [40];
  HMpsFF *local_18;
  Parsekey local_4;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  local_71 = 0;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd20,
             (size_type)in_stack_fffffffffffffd18,(bool *)0x462684);
  rVar6._M_mask = in_stack_fffffffffffffe30;
  rVar6._M_p = in_stack_fffffffffffffe28;
  rVar5._M_mask = in_stack_fffffffffffffd40;
  rVar5._M_p = in_stack_fffffffffffffd48;
  local_90 = 0;
  local_98 = 1;
  local_a0 = 0;
  local_a8 = 1;
  while( true ) {
    do {
      bVar2 = getMpsLine(in_stack_fffffffffffffd38,(istream *)in_stack_fffffffffffffd30,
                         (string *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                         (bool *)in_stack_fffffffffffffd20);
      if (!bVar2) {
        local_4 = kFail;
        local_ac = 1;
        goto LAB_00463372;
      }
    } while ((local_85 & 1) != 0);
    bVar2 = timeout(in_stack_fffffffffffffd20);
    if (bVar2) break;
    std::__cxx11::string::string(local_e0);
    local_e4 = checkFirstWord((HMpsFF *)in_stack_fffffffffffffe48._M_cur,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                              (size_t *)in_stack_fffffffffffffe38,(size_t *)rVar6._M_mask,
                              (string *)rVar6._M_p);
    if (local_e4 == kNone) {
      first_word((string *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                 in_stack_fffffffffffffd90);
      local_110 = first_word_end((string *)
                                 CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                                 (size_t)in_stack_fffffffffffffd70);
      std::__cxx11::string::operator=(local_e0,"");
      first_word((string *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                 in_stack_fffffffffffffd90);
      std::__cxx11::string::operator=(local_e0,local_130);
      std::__cxx11::string::~string(local_130);
      local_c0 = first_word_end((string *)
                                CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                                (size_t)in_stack_fffffffffffffd70);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
      if (bVar2) {
        trim((string *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        pHVar1 = local_18;
        uVar3 = std::__cxx11::string::c_str();
        highsLogUser((HighsLogOptions *)pHVar1,kError,"No range given for row \"%s\"\n",uVar3);
        local_4 = kFail;
        local_ac = 1;
      }
      else {
        local_138._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_fffffffffffffd18,(key_type *)0x462a2e);
        local_140._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffd18);
        bVar2 = std::__detail::operator==(&local_138,&local_140);
        pHVar1 = local_18;
        if (bVar2) {
          local_90 = local_90 + 1;
          if (local_90 % local_98 == 0) {
            std::__cxx11::string::c_str();
            highsLogUser((HighsLogOptions *)pHVar1,kWarning,
                         "Row name \"%s\" in RANGES section is not defined: ignored\n");
            local_98 = local_98 << 1;
          }
        }
        else {
          parseRanges::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd30,
                     (string *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                     (HighsInt *)in_stack_fffffffffffffd20);
          pHVar1 = local_18;
          if (local_e8 < 0) {
            local_90 = local_90 + 1;
            if (local_90 % local_98 == 0) {
              std::__cxx11::string::c_str();
              highsLogUser((HighsLogOptions *)pHVar1,kWarning,
                           "Row name \"%s\" in RANGES section is not valid: ignored\n");
              local_98 = local_98 << 1;
            }
          }
          else {
            local_141 = 0;
            local_150 = (HighsLogOptions *)
                        getValue(in_stack_fffffffffffffd70,
                                 (string *)in_stack_fffffffffffffd68._M_cur,
                                 (bool *)in_stack_fffffffffffffd60,
                                 (HighsInt)((ulong)in_stack_fffffffffffffd58 >> 0x20));
            rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)rVar5._M_mask,
                               (size_type)in_stack_fffffffffffffd38);
            local_160 = rVar4;
            bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_160);
            pHVar1 = local_18;
            if (bVar2) {
              local_a0 = local_a0 + 1;
              if (local_a0 % local_a8 == 0) {
                std::__cxx11::string::c_str();
                highsLogUser(local_150,(HighsLogType)pHVar1,(char *)0x4,
                             "Row name \"%s\" in RANGES section has duplicate value %g: ignored\n");
                local_a8 = local_a8 << 1;
              }
            }
            else {
              if ((local_141 & 1) != 0) {
                uVar3 = std::__cxx11::string::c_str();
                highsLogUser((HighsLogOptions *)pHVar1,kError,"Range for row \"%s\" is NaN\n",uVar3)
                ;
                local_4 = kFail;
                local_ac = 1;
                goto LAB_00463314;
              }
              parseRanges::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd50,(double)rVar5._M_p,
                         (HighsInt *)rVar5._M_mask);
            }
          }
        }
        in_stack_fffffffffffffd9f =
             is_end((string *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30,
                    (string *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
        if (!(bool)in_stack_fffffffffffffd9f) {
          first_word((string *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd90);
          in_stack_fffffffffffffd90 =
               first_word_end((string *)
                              CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                              (size_t)in_stack_fffffffffffffd70);
          local_188 = in_stack_fffffffffffffd90;
          std::__cxx11::string::operator=(local_e0,"");
          first_word((string *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd90);
          std::__cxx11::string::operator=(local_e0,local_1a8);
          std::__cxx11::string::~string(local_1a8);
          local_c0 = first_word_end((string *)
                                    CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                                    (size_t)in_stack_fffffffffffffd70);
          in_stack_fffffffffffffd7f =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
          if ((bool)in_stack_fffffffffffffd7f) {
            trim((string *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
            in_stack_fffffffffffffd70 = local_18;
            uVar3 = std::__cxx11::string::c_str();
            highsLogUser((HighsLogOptions *)in_stack_fffffffffffffd70,kError,
                         "No range given for row \"%s\"\n",uVar3);
            local_4 = kFail;
            local_ac = 1;
          }
          else {
            in_stack_fffffffffffffd68._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)in_stack_fffffffffffffd18,(key_type *)0x462f45);
            local_1b0._M_cur = in_stack_fffffffffffffd68._M_cur;
            in_stack_fffffffffffffe48._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)in_stack_fffffffffffffd18);
            bVar2 = std::__detail::operator==
                              (&local_1b0,
                               (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                *)&stack0xfffffffffffffe48);
            if (bVar2) {
              local_90 = local_90 + 1;
              if (local_90 % local_98 == 0) {
                in_stack_fffffffffffffd60 = local_18;
                uVar3 = std::__cxx11::string::c_str();
                highsLogUser((HighsLogOptions *)in_stack_fffffffffffffd60,kWarning,
                             "Row name \"%s\" in RANGES section is not defined: ignored\n",uVar3);
                local_98 = local_98 << 1;
              }
            }
            else {
              parseRanges::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd30,
                         (string *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                         (HighsInt *)in_stack_fffffffffffffd20);
              this_00 = (vector<bool,_std::allocator<bool>_> *)rVar5._M_mask;
              if (local_e8 < 0) {
                local_90 = local_90 + 1;
                if (local_90 % local_98 == 0) {
                  in_stack_fffffffffffffd58 = local_18;
                  uVar3 = std::__cxx11::string::c_str();
                  highsLogUser((HighsLogOptions *)in_stack_fffffffffffffd58,kWarning,
                               "Row name \"%s\" in RANGES section is not valid: ignored\n",uVar3);
                  local_98 = local_98 << 1;
                }
              }
              else {
                in_stack_fffffffffffffe47 = 0;
                in_stack_fffffffffffffd50 =
                     (HighsLogOptions *)
                     getValue(in_stack_fffffffffffffd70,(string *)in_stack_fffffffffffffd68._M_cur,
                              (bool *)in_stack_fffffffffffffd60,
                              (HighsInt)((ulong)in_stack_fffffffffffffd58 >> 0x20));
                in_stack_fffffffffffffe38 = in_stack_fffffffffffffd50;
                rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  (this_00,(size_type)in_stack_fffffffffffffd38);
                rVar6 = rVar5;
                bVar2 = std::_Bit_reference::operator_cast_to_bool
                                  ((_Bit_reference *)&stack0xfffffffffffffe28);
                if (bVar2) {
                  local_a0 = local_a0 + 1;
                  if (local_a0 % local_a8 == 0) {
                    in_stack_fffffffffffffd38 = local_18;
                    uVar3 = std::__cxx11::string::c_str();
                    highsLogUser(in_stack_fffffffffffffe38,(HighsLogType)in_stack_fffffffffffffd38,
                                 (char *)0x4,
                                 "Row name \"%s\" in RANGES section has duplicate value %g: ignored\n"
                                 ,uVar3);
                    local_a8 = local_a8 << 1;
                  }
                }
                else {
                  if ((in_stack_fffffffffffffe47 & 1) != 0) {
                    in_stack_fffffffffffffd30 = local_18;
                    uVar3 = std::__cxx11::string::c_str();
                    highsLogUser((HighsLogOptions *)in_stack_fffffffffffffd30,kError,
                                 "Range for row \"%s\" is NaN\n",uVar3);
                    local_4 = kFail;
                    local_ac = 1;
                    goto LAB_004632ed;
                  }
                  parseRanges::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd50,(double)rVar5._M_p
                             ,(HighsInt *)rVar5._M_mask);
                }
              }
            }
            in_stack_fffffffffffffd2f =
                 is_end((string *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30,
                        (string *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
            if ((bool)in_stack_fffffffffffffd2f) {
              local_ac = 0;
            }
            else {
              trim((string *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
              in_stack_fffffffffffffd20 = local_18;
              uVar3 = std::__cxx11::string::c_str();
              highsLogUser((HighsLogOptions *)in_stack_fffffffffffffd20,kError,
                           "Unknown specifiers in RANGES section for row \"%s\"\n",uVar3);
              local_4 = kFail;
              local_ac = 1;
            }
          }
LAB_004632ed:
          std::__cxx11::string::~string(local_180);
          if (local_ac != 0) goto LAB_00463314;
        }
        local_ac = 0;
      }
LAB_00463314:
      std::__cxx11::string::~string(local_108);
    }
    else {
      local_1f1 = local_90 != 0 || local_a0 != 0;
      *(bool *)(in_RDI + 8) = local_1f1;
      if ((*(byte *)(in_RDI + 8) & 1) != 0) {
        highsLogUser((HighsLogOptions *)local_18,kWarning,
                     "RANGES section: ignored %d undefined/illegal rows and %d duplicate values\n",
                     local_90 & 0xffffffff,local_a0 & 0xffffffff);
      }
      highsLogDev((HighsLogOptions *)local_18,kInfo,"readMPS: Read RANGES  OK\n");
      local_4 = local_e4;
      local_ac = 1;
    }
    std::__cxx11::string::~string(local_e0);
    if (local_ac != 0) {
LAB_00463372:
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      return local_4;
    }
  }
  local_4 = kTimeout;
  local_ac = 1;
  goto LAB_00463372;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRanges(const HighsLogOptions& log_options,
                                     std::istream& file) {
  std::string strline, word;

  auto parseName = [this](const std::string& name, HighsInt& rowidx) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    assert(rowidx < num_row);
  };

  auto addRhs = [this](double val, HighsInt& rowidx) {
    if ((row_type[rowidx] == Boundtype::kEq && val < 0) ||
        row_type[rowidx] == Boundtype::kLe) {
      assert(row_upper.at(rowidx) < kHighsInf);
      row_lower.at(rowidx) = row_upper.at(rowidx) - fabs(val);
    } else if ((row_type[rowidx] == Boundtype::kEq && val > 0) ||
               row_type[rowidx] == Boundtype::kGe) {
      assert(row_lower.at(rowidx) > (-kHighsInf));
      row_upper.at(rowidx) = row_lower.at(rowidx) + fabs(val);
    }
    has_row_entry_[rowidx] = true;
  };

  // Initialise tracking for duplicate entries
  has_row_entry_.assign(num_row, false);

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_range = 0;
  size_t report_ignored_duplicate_range_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin, end;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    if (key != Parsekey::kNone) {
      warning_issued_ =
          num_ignored_row_name > 0 || num_ignored_duplicate_range > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "RANGES section: ignored %d undefined/illegal rows and %d "
                     "duplicate values\n",
                     int(num_ignored_row_name),
                     int(num_ignored_duplicate_range));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read RANGES  OK\n");
      return key;
    }

    HighsInt rowidx;

    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No range given for row \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);
    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Row name \"%s\" in RANGES section is not defined: ignored\n",
            marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      parseName(marker, rowidx);
      if (rowidx < 0) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RANGES section is not valid: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
      } else {
        bool is_nan = false;
        double value = getValue(word, is_nan);  // atof(word.c_str());
        if (has_row_entry_[rowidx]) {
          num_ignored_duplicate_range++;
          if (num_ignored_duplicate_range %
                  report_ignored_duplicate_range_frequency ==
              0) {
            highsLogUser(log_options, HighsLogType::kWarning,
                         "Row name \"%s\" in RANGES section has duplicate "
                         "value %g: ignored\n",
                         marker.c_str(), value);
            report_ignored_duplicate_range_frequency *= 2;
          }
        } else {
          if (is_nan) {
            highsLogUser(log_options, HighsLogType::kError,
                         "Range for row \"%s\" is NaN\n", marker.c_str());
            return HMpsFF::Parsekey::kFail;
          }
          addRhs(value, rowidx);
        }
      }
    }

    if (!is_end(strline, end)) {
      std::string marker = first_word(strline, end);
      size_t end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No range given for row \"%s\"\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RANGES section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
      } else {
        parseName(marker, rowidx);
        if (rowidx < 0) {
          num_ignored_row_name++;
          if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
            highsLogUser(
                log_options, HighsLogType::kWarning,
                "Row name \"%s\" in RANGES section is not valid: ignored\n",
                marker.c_str());
            report_ignored_row_name_frequency *= 2;
          }
        } else {
          bool is_nan = false;
          double value = getValue(word, is_nan);  // atof(word.c_str());
          if (has_row_entry_[rowidx]) {
            num_ignored_duplicate_range++;
            if (num_ignored_duplicate_range %
                    report_ignored_duplicate_range_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Row name \"%s\" in RANGES section has duplicate "
                           "value %g: ignored\n",
                           marker.c_str(), value);
              report_ignored_duplicate_range_frequency *= 2;
            }
          } else {
            if (is_nan) {
              highsLogUser(log_options, HighsLogType::kError,
                           "Range for row \"%s\" is NaN\n", marker.c_str());
              return HMpsFF::Parsekey::kFail;
            }
            addRhs(value, rowidx);
          }
        }
      }

      if (!is_end(strline, end)) {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "Unknown specifiers in RANGES section for row \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
    }
  }

  return HMpsFF::Parsekey::kFail;
}